

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_dialer_set_size(nni_ws_dialer *d,size_t *valp,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  size_t sStack_38;
  int rv;
  size_t val;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  size_t *valp_local;
  nni_ws_dialer *d_local;
  
  val._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)buf;
  buf_local = valp;
  valp_local = (size_t *)d;
  iVar1 = nni_copyin_size(&stack0xffffffffffffffc8,buf,sz,0,0xffffffff,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)(valp_local + 0xb));
    *(size_t *)buf_local = sStack_38;
    nni_mtx_unlock((nni_mtx *)(valp_local + 0xb));
  }
  return iVar1;
}

Assistant:

static int
ws_dialer_set_size(
    nni_ws_dialer *d, size_t *valp, const void *buf, size_t sz, nni_type t)
{
	size_t val;
	int    rv;

	// Max size is limited to 4 GB, but you really never want to have
	// to have a larger value.  If you think you need that, you're doing it
	// wrong.  You *can* set the size to 0 for unlimited.
	if ((rv = nni_copyin_size(&val, buf, sz, 0, NNI_MAXSZ, t)) == 0) {
		nni_mtx_lock(&d->mtx);
		*valp = val;
		nni_mtx_unlock(&d->mtx);
	}
	return (rv);
}